

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheMove(PgHdr *p,Pgno newPgno)

{
  i64 *piVar1;
  PCache *pPVar2;
  PgHdr *p_00;
  sqlite3_pcache_page *psVar3;
  
  pPVar2 = p->pCache;
  psVar3 = (*sqlite3Config.pcache2.xFetch)(pPVar2->pCache,newPgno,0);
  if (psVar3 != (sqlite3_pcache_page *)0x0) {
    p_00 = (PgHdr *)psVar3->pExtra;
    piVar1 = &p_00->nRef;
    *piVar1 = *piVar1 + 1;
    pPVar2->nRefSum = pPVar2->nRefSum + 1;
    sqlite3PcacheDrop(p_00);
  }
  (*sqlite3Config.pcache2.xRekey)(pPVar2->pCache,p->pPage,p->pgno,newPgno);
  p->pgno = newPgno;
  if ((~*(uint *)&p->flags & 10) == 0) {
    pcacheManageDirtyList(p,'\x03');
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheMove(PgHdr *p, Pgno newPgno){
  PCache *pCache = p->pCache;
  sqlite3_pcache_page *pOther;
  assert( p->nRef>0 );
  assert( newPgno>0 );
  assert( sqlite3PcachePageSanity(p) );
  pcacheTrace(("%p.MOVE %d -> %d\n",pCache,p->pgno,newPgno));
  pOther = sqlite3GlobalConfig.pcache2.xFetch(pCache->pCache, newPgno, 0);
  if( pOther ){
    PgHdr *pXPage = (PgHdr*)pOther->pExtra;
    assert( pXPage->nRef==0 );
    pXPage->nRef++;
    pCache->nRefSum++;
    sqlite3PcacheDrop(pXPage);
  }
  sqlite3GlobalConfig.pcache2.xRekey(pCache->pCache, p->pPage, p->pgno,newPgno);
  p->pgno = newPgno;
  if( (p->flags&PGHDR_DIRTY) && (p->flags&PGHDR_NEED_SYNC) ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    assert( sqlite3PcachePageSanity(p) );
  }
}